

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessGetData
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,atomic<bool> *interruptMsgProc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *ppuVar1;
  int iVar2;
  uint uVar3;
  _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
  *this_01;
  CBlockIndex *pCVar4;
  uint256 *puVar5;
  CConnman *this_02;
  pointer ppCVar6;
  uint256 *puVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  iterator __first;
  string msg_type;
  iterator __last;
  undefined1 auVar11 [16];
  base_blob<256U> *pbVar12;
  element_type *block;
  bool bVar13;
  char cVar14;
  TxRelay *pTVar15;
  const_iterator cVar16;
  uchar *puVar17;
  CBlockIndex *pCVar18;
  Logger *pLVar19;
  Chainstate *pCVar20;
  undefined7 extraout_var;
  uint64_t nonce;
  mutex_type *pmVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer ppVar24;
  _Base_ptr this_03;
  long in_FS_OFFSET;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  undefined8 in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc8;
  char in_stack_fffffffffffffccf;
  PeerManagerImpl *pPVar31;
  CBlockIndex *in_stack_fffffffffffffcd8;
  char in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffce9;
  Peer *pPVar32;
  _Elt_pointer local_308;
  _Map_pointer local_300;
  vector<CInv,_std::allocator<CInv>_> vNotFound;
  GetDataMsg local_2dc;
  vector<CInv,_std::allocator<CInv>_> vInv;
  shared_ptr<const_CBlock> pblock;
  FlatFilePos block_pos;
  element_type *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  shared_ptr<const_CBlockHeaderAndShortTxIDs> a_recent_compact_block;
  shared_ptr<const_CBlock> a_recent_block;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  string local_258;
  string local_238;
  string local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  TransactionSerParams maybe_with_witness;
  undefined1 auStack_1d7 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [11];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock51;
  CInv *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  undefined1 auStack_f0 [8];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  CPartialMerkleTree local_c8;
  undefined1 local_78 [16];
  pointer local_68;
  undefined1 local_58 [20];
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined6 uStack_40;
  uchar local_3a [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar15 = Peer::GetTxRelay(peer);
  paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
  local_308 = (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
  local_300 = (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (paVar23 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur) {
    in_stack_fffffffffffffcd8 = (CBlockIndex *)&this->m_most_recent_block_mutex;
    paVar22 = paVar23;
    do {
      iVar2 = *(int *)paVar22;
      paVar23 = paVar22;
      if (((iVar2 != 1) && (iVar2 != 0x40000001)) && (iVar2 != 5)) break;
      if ((((__int_type_conflict2)interruptMsgProc->_M_base)._M_i & 1U) != 0) goto LAB_00900016;
      if (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0) break;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar22 + 0x24);
      if (paVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308) {
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300[1];
        local_300 = local_300 + 1;
        local_308 = (_Elt_pointer)((long)paVar23 + 0x1f8);
      }
      if (pTVar15 != (TxRelay *)0x0) {
        ToGenTxid((GenTxid *)&maybe_with_witness,(CInv *)paVar22);
        CTxMemPool::info_for_relay
                  ((TxMempoolInfo *)&criticalblock51,this->m_mempool,(GenTxid *)&maybe_with_witness,
                   pTVar15->m_last_inv_sequence);
        pmVar21 = criticalblock51.super_unique_lock._M_device;
        if (criticalblock51.super_unique_lock._M_device == (mutex_type *)0x0) {
          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
          local_58._0_8_ = in_stack_fffffffffffffcd8;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_58);
          this_01 = &((this->m_most_recent_block_txs)._M_t.
                      super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                     ._M_head_impl)->_M_t;
          if ((this_01 ==
               (_Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                *)0x0) ||
             (cVar16 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>,_std::_Select1st<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                       ::find(this_01,(key_type *)auStack_1d7),
             cVar16._M_node ==
             (_Base_ptr)
             ((long)&(((this->m_most_recent_block_txs)._M_t.
                       super___uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_*,_false>
                      ._M_head_impl)->_M_t)._M_impl + 8U))) {
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
            this_03 = (_Base_ptr)0x0;
            pmVar21 = (mutex_type *)0x0;
          }
          else {
            pmVar21 = *(mutex_type **)(cVar16._M_node + 2);
            this_03 = cVar16._M_node[2]._M_parent;
            if (this_03 != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&this_03->_M_parent = *(int *)&this_03->_M_parent + 1;
              }
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_58);
          }
        }
        else {
          this_03 = (_Base_ptr)criticalblock51.super_unique_lock._8_8_;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock51.super_unique_lock._M_owns = false;
          criticalblock51.super_unique_lock._9_7_ = 0;
        }
        if (criticalblock51.super_unique_lock._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     criticalblock51.super_unique_lock._8_8_);
        }
        if (pmVar21 == (mutex_type *)0x0) {
          if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CInv,std::allocator<CInv>>::_M_realloc_insert<CInv_const&>
                      ((vector<CInv,std::allocator<CInv>> *)&vNotFound,
                       (iterator)
                       vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar22)
            ;
          }
          else {
            *(undefined4 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0x1c) = *(undefined4 *)(paVar22 + 2);
            sVar8 = paVar22->_M_allocated_capacity;
            uVar9 = *(undefined8 *)((long)paVar22 + 8);
            uVar10 = *(undefined8 *)((long)paVar22 + 0x18);
            *(size_type *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0xc) = paVar22[1]._M_allocated_capacity;
            *(undefined8 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems +
             0x14) = uVar10;
            (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
             super__Vector_impl_data._M_finish)->type = (int)sVar8;
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[0] =
                 (char)(sVar8 >> 0x20);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[1] =
                 (char)(sVar8 >> 0x28);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[2] =
                 (char)(sVar8 >> 0x30);
            ((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems[3] =
                 (char)(sVar8 >> 0x38);
            *(undefined8 *)
             (((vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish)->hash).super_base_blob<256U>.m_data._M_elems + 4)
                 = uVar9;
            vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          maybe_with_witness.allow_witness = *(int *)paVar22 != 1;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"tx","");
          criticalblock51.super_unique_lock._8_8_ = pmVar21;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)&maybe_with_witness;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((PeerManagerImpl *)this,pfrom,&local_238,
                     (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&criticalblock51);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          CTxMemPool::RemoveUnbroadcastTx
                    (this->m_mempool,
                     (uint256 *)((long)&pmVar21[1].super___mutex_base._M_mutex + 0x11),false);
        }
        if (this_03 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
        }
      }
      paVar22 = paVar23;
    } while (paVar23 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur);
  }
  paVar22 = paVar23;
  if ((paVar23 ==
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur) || (((pfrom->fPauseSend)._M_base._M_i & 1U) != 0)
     ) goto LAB_008fff3f;
  paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar23 + 0x24);
  if (paVar22 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308) {
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300[1];
    local_300 = local_300 + 1;
  }
  if ((2 < *(int *)paVar23 - 2U) &&
     (interruptMsgProc = (atomic<bool> *)paVar23, *(int *)paVar23 != 0x40000002)) goto LAB_008fff3f;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  criticalblock51.super_unique_lock._M_owns = false;
  criticalblock51.super_unique_lock._M_device = &(this->m_most_recent_block_mutex).super_mutex;
  pPVar31 = this;
  std::unique_lock<std::mutex>::lock(&criticalblock51.super_unique_lock);
  this_00 = &a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_most_recent_block).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&(this->m_most_recent_block).
                      super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  a_recent_compact_block.
  super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_most_recent_compact_block).
       super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->m_most_recent_compact_block).
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock51.super_unique_lock);
  criticalblock51.super_unique_lock._0_9_ = ZEXT89(0x13bf540);
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  puVar7 = (uint256 *)((long)paVar23 + 4);
  interruptMsgProc = (atomic<bool> *)paVar23;
  pCVar18 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,puVar7);
  if ((pCVar18 == (CBlockIndex *)0x0) || (pCVar18->m_chain_tx_count == 0)) {
LAB_0090017d:
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  }
  else {
    uVar3 = pCVar18->nStatus;
    if ((uVar3 & 0x60) == 0 && 4 < (uVar3 & 7)) goto LAB_0090017d;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock51);
    if ((uVar3 & 0x60) == 0 && 1 < (uVar3 & 7)) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = &aStack_100;
      criticalblock51.super_unique_lock = (unique_lock)(auVar11 << 0x40);
      _local_108 = ZEXT89(0);
      auStack_f0 = (undefined1  [8])(local_e8 + 8);
      local_e8._0_9_ = ZEXT89(0);
      pCVar20 = ChainstateManager::ActiveChainstate(this->m_chainman);
      local_298 = a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_290 = a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_298;
      bVar13 = Chainstate::ActivateBestChain
                         (pCVar20,(BlockValidationState *)&criticalblock51,pblock_00);
      if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
      }
      if (!bVar13) {
        pLVar19 = LogInstance();
        bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
        if (bVar13) {
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    ((string *)&maybe_with_witness,
                     (ValidationState<BlockValidationResult> *)&criticalblock51);
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_06._M_len = 0x62;
          logging_function_06._M_str = "ProcessGetBlockData";
          logging_function_06._M_len = 0x13;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_06,source_file_06,0x99b,NET,Debug,
                     (ConstevalFormatString<1U>)0xf9deec,(string *)&maybe_with_witness);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_1c8) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_1c8[0]._M_local_buf[7],
                                     CONCAT16(local_1c8[0]._M_local_buf[6],
                                              CONCAT24(local_1c8[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_1c8[0]._M_allocated_capacity))) + 1);
          }
        }
      }
      if (auStack_f0 != (undefined1  [8])(local_e8 + 8)) {
        operator_delete((void *)auStack_f0,local_e8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)criticalblock51.super_unique_lock._8_8_ != &aStack_100) {
        operator_delete((void *)criticalblock51.super_unique_lock._8_8_,
                        (ulong)(aStack_100._M_allocated_capacity + 1));
      }
    }
  }
  block_pos.nFile = -1;
  block_pos.nPos = 0;
  criticalblock51.super_unique_lock._0_9_ = ZEXT89(0x13bf540);
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  pCVar18 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,puVar7);
  if (pCVar18 == (CBlockIndex *)0x0) {
LAB_00900332:
    bVar13 = false;
    in_stack_fffffffffffffce8 = false;
    in_stack_fffffffffffffce9 = 0;
    in_stack_fffffffffffffcd8 = (CBlockIndex *)0x0;
  }
  else {
    bVar13 = BlockRequestAllowed(this,pCVar18);
    if (!bVar13) {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x62;
        logging_function_00._M_str = "ProcessGetBlockData";
        logging_function_00._M_len = 0x13;
        LogPrintFormatInternal<char[20],long>
                  (logging_function_00,source_file_00,0x9aa,NET,Debug,
                   (ConstevalFormatString<2U>)0xf9ea4d,(char (*) [20])"ProcessGetBlockData",
                   (long *)&maybe_with_witness);
      }
      goto LAB_00900332;
    }
    bVar13 = CConnman::OutboundTargetReached(this->m_connman,true);
    if ((bVar13) &&
       ((((pCVar4 = this->m_chainman->m_best_header, pCVar4 != (CBlockIndex *)0x0 &&
          (0x93a80 < (long)((ulong)pCVar4->nTime - (ulong)pCVar18->nTime))) ||
         (*(int *)interruptMsgProc == 3)) && ((pfrom->m_permission_flags & Download) == None)))) {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        logging_function._M_str = "ProcessGetBlockData";
        logging_function._M_len = 0x13;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,0x9b2,NET,Debug,(ConstevalFormatString<1U>)0xf9ea9b,
                   (long *)&maybe_with_witness);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
      goto LAB_00900332;
    }
    pCVar20 = ChainstateManager::ActiveChainstate(this->m_chainman);
    ppCVar6 = (pCVar20->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 ==
        (pCVar20->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      in_stack_fffffffffffffcd8 = (CBlockIndex *)0x0;
    }
    else {
      in_stack_fffffffffffffcd8 = ppCVar6[-1];
    }
    if ((((~pfrom->m_permission_flags & 0x50) == 0) ||
        ((peer->m_our_services & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NETWORK_LIMITED)) ||
       (in_stack_fffffffffffffcd8->nHeight - pCVar18->nHeight < 0x123)) {
      if ((pCVar18->nStatus & 8) == 0) goto LAB_0090076f;
      in_stack_fffffffffffffce8 = CanDirectFetch(this);
      block_pos.nFile = -(uint)((pCVar18->nStatus & 8) == 0) | pCVar18->nFile;
      block_pos.nPos = (int)(pCVar18->nStatus << 0x1c) >> 0x1f & pCVar18->nDataPos;
      bVar13 = true;
      in_stack_fffffffffffffce9 = extraout_var;
    }
    else {
      pLVar19 = LogInstance();
      bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
      if (bVar13) {
        _maybe_with_witness = (TransactionSerParams *)pfrom->id;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x62;
        logging_function_01._M_str = "ProcessGetBlockData";
        logging_function_01._M_len = 0x13;
        LogPrintFormatInternal<long>
                  (logging_function_01,source_file_01,0x9bb,NET,Debug,
                   (ConstevalFormatString<1U>)0xf9ead7,(long *)&maybe_with_witness);
      }
      LOCK();
      (pfrom->fDisconnect)._M_base._M_i = true;
      UNLOCK();
LAB_0090076f:
      bVar13 = false;
      in_stack_fffffffffffffce8 = false;
      in_stack_fffffffffffffce9 = 0;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock51);
  if (bVar13) {
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
LAB_009003c1:
      if (*(int *)interruptMsgProc == 0x40000002) {
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cVar14 = ::node::BlockManager::ReadRawBlockFromDisk
                           (&this->m_chainman->m_blockman,&block_data,&block_pos);
        if ((bool)cVar14) {
          uStack_44 = 0x6b;
          local_218._M_dataplus._M_p =
               (pointer)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_218._M_string_length =
               (size_type)
               (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish +
               -(long)block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
          this_02 = this->m_connman;
          local_1c8[0]._0_1_ = 'b';
          local_1c8[0]._1_1_ = 'l';
          local_1c8[0]._2_1_ = 'o';
          local_1c8[0]._3_1_ = 'c';
          local_1c8[0]._4_1_ = 'k';
          local_1c8[0]._5_1_ = '\0';
          local_1c8[0]._M_local_buf[6] = (undefined1)uStack_42;
          local_1c8[0]._M_local_buf[7] = (undefined1)((ushort)uStack_42 >> 8);
          local_1c8[0]._8_2_ = (undefined2)uStack_40;
          local_1c8[0]._M_local_buf[10] = (undefined1)((uint6)uStack_40 >> 0x10);
          local_1c8[0]._M_local_buf[0xb] = (undefined1)((uint6)uStack_40 >> 0x18);
          local_1c8[0]._12_2_ = (undefined2)((uint6)uStack_40 >> 0x20);
          local_1c8[0]._14_1_ = local_3a[0];
          local_1c8[0]._15_1_ = local_3a[1];
          local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
          local_58._8_8_ = (_Elt_pointer)0x0;
          local_58._16_4_ = 0x636f6c00;
          msg_type._M_string_length = (size_type)pfrom;
          msg_type._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcb8;
          msg_type.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffcc8;
          msg_type.field_2._M_local_buf[7] = cVar14;
          msg_type.field_2._8_8_ = pPVar31;
          _maybe_with_witness = (TransactionSerParams *)local_1c8;
          local_58._0_8_ = (CBlockIndex *)(local_58 + 0x10);
          NetMsg::Make<Span<unsigned_char>>
                    ((CSerializedNetMsg *)&criticalblock51,(NetMsg *)&maybe_with_witness,msg_type,
                     (Span<unsigned_char> *)&local_218);
          CConnman::PushMessage(this_02,pfrom,(CSerializedNetMsg *)&criticalblock51);
          this = pPVar31;
          if ((undefined1 *)aStack_100._M_allocated_capacity != auStack_f0) {
            operator_delete((void *)aStack_100._M_allocated_capacity,(long)auStack_f0 + 1);
            this = pPVar31;
          }
          if (criticalblock51.super_unique_lock._M_device != (mutex_type *)0x0) {
            operator_delete(criticalblock51.super_unique_lock._M_device,
                            (long)local_108 - (long)criticalblock51.super_unique_lock._M_device);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_1c8) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_1c8[0]._M_local_buf[7],
                                     CONCAT16(local_1c8[0]._M_local_buf[6],
                                              CONCAT24(local_1c8[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_1c8[0]._M_allocated_capacity))) + 1);
          }
          in_stack_fffffffffffffccf = cVar14;
          pPVar31 = this;
          if ((CBlockIndex *)local_58._0_8_ != (CBlockIndex *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,
                            CONCAT26(uStack_42,CONCAT24(uStack_44,local_58._16_4_)) + 1);
          }
        }
        else {
          criticalblock51.super_unique_lock._0_9_ = ZEXT89(0x13bf540);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          bVar13 = ::node::BlockManager::IsBlockPruned(&this->m_chainman->m_blockman,pCVar18);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          if (bVar13) {
            pLVar19 = LogInstance();
            bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
            if (bVar13) {
              criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_02._M_len = 0x62;
              logging_function_02._M_str = "ProcessGetBlockData";
              logging_function_02._M_len = 0x13;
              LogPrintFormatInternal<long>
                        (logging_function_02,source_file_02,0x9d2,NET,Debug,
                         (ConstevalFormatString<1U>)0xf9eb26,(long *)&criticalblock51);
            }
          }
          else {
            criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            source_file_04._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_04._M_len = 0x62;
            logging_function_04._M_str = "ProcessGetBlockData";
            logging_function_04._M_len = 0x13;
            LogPrintFormatInternal<long>
                      (logging_function_04,source_file_04,0x9d4,ALL,Error,
                       (ConstevalFormatString<1U>)0xf9eb64,(long *)&criticalblock51);
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        if (block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(block_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)block_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)block_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        _maybe_with_witness = (TransactionSerParams *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<CBlock,std::allocator<CBlock>>
                  (&local_1d0,(CBlock **)&maybe_with_witness,(allocator<CBlock> *)&criticalblock51);
        cVar14 = ::node::BlockManager::ReadBlockFromDisk
                           (&this->m_chainman->m_blockman,(CBlock *)_maybe_with_witness,&block_pos);
        if ((bool)cVar14) {
          pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_maybe_with_witness;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_1d0);
        }
        else {
          criticalblock51.super_unique_lock._0_9_ = ZEXT89(0x13bf540);
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          bVar13 = ::node::BlockManager::IsBlockPruned(&this->m_chainman->m_blockman,pCVar18);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock51);
          if (bVar13) {
            pLVar19 = LogInstance();
            bVar13 = BCLog::Logger::WillLogCategoryLevel(pLVar19,NET,Debug);
            if (bVar13) {
              criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
              source_file_03._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_03._M_len = 0x62;
              logging_function_03._M_str = "ProcessGetBlockData";
              logging_function_03._M_len = 0x13;
              LogPrintFormatInternal<long>
                        (logging_function_03,source_file_03,0x9e0,NET,Debug,
                         (ConstevalFormatString<1U>)0xf9eb26,(long *)&criticalblock51);
            }
          }
          else {
            criticalblock51.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_05._M_len = 0x62;
            logging_function_05._M_str = "ProcessGetBlockData";
            logging_function_05._M_len = 0x13;
            LogPrintFormatInternal<long>
                      (logging_function_05,source_file_05,0x9e2,ALL,Error,
                       (ConstevalFormatString<1U>)0xf9eb64,(long *)&criticalblock51);
          }
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
        if ((element_type *)local_1d0._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
        }
      }
      if (cVar14 != '\0') goto LAB_00900a3b;
    }
    else {
      CBlockHeader::GetHash
                ((uint256 *)&criticalblock51,
                 &(a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_CBlockHeader);
      puVar5 = pCVar18->phashBlock;
      if (puVar5 == (uint256 *)0x0) goto LAB_00901193;
      auVar25[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0] ==
                    (uchar)criticalblock51.super_unique_lock._M_device);
      auVar25[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[1] ==
                    criticalblock51.super_unique_lock._M_device._1_1_);
      auVar25[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[2] ==
                    criticalblock51.super_unique_lock._M_device._2_1_);
      auVar25[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[3] ==
                    criticalblock51.super_unique_lock._M_device._3_1_);
      auVar25[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[4] ==
                    criticalblock51.super_unique_lock._M_device._4_1_);
      auVar25[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[5] ==
                    criticalblock51.super_unique_lock._M_device._5_1_);
      auVar25[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[6] ==
                    criticalblock51.super_unique_lock._M_device._6_1_);
      auVar25[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[7] ==
                    criticalblock51.super_unique_lock._M_device._7_1_);
      auVar25[8] = -((bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8] ==
                    criticalblock51.super_unique_lock._M_owns);
      auVar25[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[9] ==
                    criticalblock51.super_unique_lock._9_1_);
      auVar25[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[10] ==
                     criticalblock51.super_unique_lock._10_1_);
      auVar25[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      criticalblock51.super_unique_lock._11_1_);
      auVar25[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      criticalblock51.super_unique_lock._12_1_);
      auVar25[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      criticalblock51.super_unique_lock._13_1_);
      auVar25[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      criticalblock51.super_unique_lock._14_1_);
      auVar25[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      criticalblock51.super_unique_lock._15_1_);
      auVar28[0] = -(local_108._0_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x10]);
      auVar28[1] = -(local_108._1_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x11]);
      auVar28[2] = -(local_108._2_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x12]);
      auVar28[3] = -(local_108._3_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x13]);
      auVar28[4] = -(local_108._4_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x14]);
      auVar28[5] = -(local_108._5_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x15]);
      auVar28[6] = -(local_108._6_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x16]);
      auVar28[7] = -(local_108._7_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x17]);
      auVar28[8] = -(aStack_100._M_local_buf[0] ==
                    (puVar5->super_base_blob<256U>).m_data._M_elems[0x18]);
      auVar28[9] = -(aStack_100._M_local_buf[1] ==
                    (puVar5->super_base_blob<256U>).m_data._M_elems[0x19]);
      auVar28[10] = -(aStack_100._M_local_buf[2] ==
                     (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a]);
      auVar28[0xb] = -(aStack_100._M_local_buf[3] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b]);
      auVar28[0xc] = -(aStack_100._M_local_buf[4] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c]);
      auVar28[0xd] = -(aStack_100._M_local_buf[5] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d]);
      auVar28[0xe] = -(aStack_100._M_local_buf[6] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e]);
      auVar28[0xf] = -(aStack_100._M_local_buf[7] ==
                      (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f]);
      auVar25 = auVar25 & auVar28;
      if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_009003c1;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 this_00);
LAB_00900a3b:
      if (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        iVar2 = *(int *)interruptMsgProc;
        if (iVar2 < 4) {
          if (iVar2 == 2) {
            local_108._0_6_ = 0x6b636f6c62;
            criticalblock51.super_unique_lock._8_8_ = 5;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_108;
            _maybe_with_witness = &::TX_NO_WITNESS;
            local_1d0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                       (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
            goto LAB_00900d76;
          }
          if (iVar2 == 3) {
            local_d8 = (undefined1  [16])0x0;
            local_e8 = (undefined1  [16])0x0;
            stack0xffffffffffffff08 = (undefined1  [16])0x0;
            _local_108 = (undefined1  [16])0x0;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)0x0;
            criticalblock51.super_unique_lock._M_owns = false;
            criticalblock51.super_unique_lock._9_7_ = 0;
            CPartialMerkleTree::CPartialMerkleTree(&local_c8);
            local_78 = (undefined1  [16])0x0;
            local_68 = (pointer)0x0;
            pTVar15 = Peer::GetTxRelay(peer);
            if (pTVar15 != (TxRelay *)0x0) {
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish._0_1_ = 0;
              block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pTVar15;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)&block_data);
              if ((pTVar15->m_bloom_filter)._M_t.
                  super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>._M_t.
                  super__Tuple_impl<0UL,_CBloomFilter_*,_std::default_delete<CBloomFilter>_>.
                  super__Head_base<0UL,_CBloomFilter_*,_false>._M_head_impl == (CBloomFilter *)0x0)
              {
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)&block_data);
              }
              else {
                CMerkleBlock::CMerkleBlock
                          ((CMerkleBlock *)&maybe_with_witness,
                           pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(pTVar15->m_bloom_filter)._M_t.
                                  super___uniq_ptr_impl<CBloomFilter,_std::default_delete<CBloomFilter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_CBloomFilter_*,_std::default_delete<CBloomFilter>_>
                                  .super__Head_base<0UL,_CBloomFilter_*,_false>._M_head_impl,
                           (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            *)0x0);
                CMerkleBlock::operator=
                          ((CMerkleBlock *)&criticalblock51,(CMerkleBlock *)&maybe_with_witness);
                CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&maybe_with_witness);
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)&block_data);
                local_1c8[0]._0_1_ = 'm';
                local_1c8[0]._1_1_ = 'e';
                local_1c8[0]._2_1_ = 'r';
                local_1c8[0]._3_1_ = 'k';
                local_1c8[0]._4_1_ = 'l';
                local_1c8[0]._5_1_ = 'e';
                local_1c8[0]._M_local_buf[6] = 'b';
                local_1c8[0]._M_local_buf[7] = 'l';
                local_1c8[0]._8_1_ = 'o';
                local_1c8[0]._9_1_ = 'c';
                local_1c8[0]._M_local_buf[10] = 'k';
                local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                local_1c8[0]._M_local_buf[0xb] = '\0';
                _maybe_with_witness = (TransactionSerParams *)local_1c8;
                (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CMerkleBlock&>
                          ((PeerManagerImpl *)this,pfrom,(string *)&maybe_with_witness,
                           (CMerkleBlock *)&criticalblock51);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_maybe_with_witness != local_1c8) {
                  operator_delete(_maybe_with_witness,
                                  CONCAT17(local_1c8[0]._M_local_buf[7],
                                           CONCAT16(local_1c8[0]._M_local_buf[6],
                                                    CONCAT24(local_1c8[0]._M_allocated_capacity.
                                                             _4_2_,(undefined4)
                                                                   local_1c8[0].
                                                                   _M_allocated_capacity))) + 1);
                }
                uVar9 = local_78._8_8_;
                if (local_78._0_8_ != local_78._8_8_) {
                  ppuVar1 = &block_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                  ppVar24 = (pointer)local_78._0_8_;
                  do {
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
                    block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT53(block_data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_5_,
                                           0x7874);
                    local_218._M_string_length =
                         (size_type)
                         ((pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[ppVar24->first].
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    local_218._M_dataplus._M_p = &::TX_NO_WITNESS.allow_witness;
                    (anonymous_namespace)::PeerManagerImpl::
                    MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                              ((PeerManagerImpl *)this,pfrom,(string *)&block_data,
                               (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&local_218
                              );
                    if ((pointer *)
                        block_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start != ppuVar1) {
                      operator_delete(block_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (ulong)(block_data.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                             ));
                    }
                    ppVar24 = ppVar24 + 1;
                  } while (ppVar24 != (pointer)uVar9);
                }
              }
            }
            CMerkleBlock::~CMerkleBlock((CMerkleBlock *)&criticalblock51);
          }
        }
        else if (iVar2 == 4) {
          if ((in_stack_fffffffffffffce8 == '\0') ||
             (pCVar18->nHeight < in_stack_fffffffffffffcd8->nHeight + -5)) {
            local_108._0_6_ = 0x6b636f6c62;
            criticalblock51.super_unique_lock._8_8_ = 5;
            criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_108;
            _maybe_with_witness = &::TX_WITH_WITNESS;
            local_1d0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                       (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
            goto LAB_00900d76;
          }
          if (a_recent_compact_block.
              super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            CBlockHeader::GetHash
                      ((uint256 *)&criticalblock51,
                       &(a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->header);
            auVar11 = _local_108;
            puVar5 = pCVar18->phashBlock;
            if (puVar5 == (uint256 *)0x0) goto LAB_00901193;
            auVar26[0] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0] ==
                          (uchar)criticalblock51.super_unique_lock._M_device);
            auVar26[1] = -((puVar5->super_base_blob<256U>).m_data._M_elems[1] ==
                          criticalblock51.super_unique_lock._M_device._1_1_);
            auVar26[2] = -((puVar5->super_base_blob<256U>).m_data._M_elems[2] ==
                          criticalblock51.super_unique_lock._M_device._2_1_);
            auVar26[3] = -((puVar5->super_base_blob<256U>).m_data._M_elems[3] ==
                          criticalblock51.super_unique_lock._M_device._3_1_);
            auVar26[4] = -((puVar5->super_base_blob<256U>).m_data._M_elems[4] ==
                          criticalblock51.super_unique_lock._M_device._4_1_);
            auVar26[5] = -((puVar5->super_base_blob<256U>).m_data._M_elems[5] ==
                          criticalblock51.super_unique_lock._M_device._5_1_);
            auVar26[6] = -((puVar5->super_base_blob<256U>).m_data._M_elems[6] ==
                          criticalblock51.super_unique_lock._M_device._6_1_);
            auVar26[7] = -((puVar5->super_base_blob<256U>).m_data._M_elems[7] ==
                          criticalblock51.super_unique_lock._M_device._7_1_);
            auVar26[8] = -((bool)(puVar5->super_base_blob<256U>).m_data._M_elems[8] ==
                          criticalblock51.super_unique_lock._M_owns);
            auVar26[9] = -((puVar5->super_base_blob<256U>).m_data._M_elems[9] ==
                          criticalblock51.super_unique_lock._9_1_);
            auVar26[10] = -((puVar5->super_base_blob<256U>).m_data._M_elems[10] ==
                           criticalblock51.super_unique_lock._10_1_);
            auVar26[0xb] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xb] ==
                            criticalblock51.super_unique_lock._11_1_);
            auVar26[0xc] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xc] ==
                            criticalblock51.super_unique_lock._12_1_);
            auVar26[0xd] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xd] ==
                            criticalblock51.super_unique_lock._13_1_);
            auVar26[0xe] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xe] ==
                            criticalblock51.super_unique_lock._14_1_);
            auVar26[0xf] = -((puVar5->super_base_blob<256U>).m_data._M_elems[0xf] ==
                            criticalblock51.super_unique_lock._15_1_);
            auVar29[0] = -(local_108._0_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x10])
            ;
            auVar29[1] = -(local_108._1_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x11])
            ;
            auVar29[2] = -(local_108._2_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x12])
            ;
            auVar29[3] = -(local_108._3_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x13])
            ;
            auVar29[4] = -(local_108._4_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x14])
            ;
            auVar29[5] = -(local_108._5_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x15])
            ;
            auVar29[6] = -(local_108._6_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x16])
            ;
            auVar29[7] = -(local_108._7_1_ == (puVar5->super_base_blob<256U>).m_data._M_elems[0x17])
            ;
            auVar29[8] = -(aStack_100._M_local_buf[0] ==
                          (puVar5->super_base_blob<256U>).m_data._M_elems[0x18]);
            auVar29[9] = -(aStack_100._M_local_buf[1] ==
                          (puVar5->super_base_blob<256U>).m_data._M_elems[0x19]);
            auVar29[10] = -(aStack_100._M_local_buf[2] ==
                           (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a]);
            auVar29[0xb] = -(aStack_100._M_local_buf[3] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b]);
            auVar29[0xc] = -(aStack_100._M_local_buf[4] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c]);
            auVar29[0xd] = -(aStack_100._M_local_buf[5] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d]);
            auVar29[0xe] = -(aStack_100._M_local_buf[6] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e]);
            auVar29[0xf] = -(aStack_100._M_local_buf[7] ==
                            (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f]);
            auVar26 = auVar26 & auVar29;
            if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
              aStack_100._M_allocated_capacity._0_2_ = 0x6b63;
              local_108 = (CInv *)0x6f6c627463706d63;
              criticalblock51.super_unique_lock._8_8_ = 10;
              criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_108;
              aStack_100._M_allocated_capacity._3_5_ = auVar11._11_5_;
              aStack_100._M_local_buf[2] = 0;
              (anonymous_namespace)::PeerManagerImpl::
              MakeAndPushMessage<CBlockHeaderAndShortTxIDs_const&>
                        ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                         a_recent_compact_block.
                         super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              goto LAB_00900d76;
            }
          }
          block = pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nonce = FastRandomContext::rand64(&this->m_rng);
          CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&criticalblock51,block,nonce);
          local_1c8[0]._0_1_ = 'c';
          local_1c8[0]._1_1_ = 'm';
          local_1c8[0]._2_1_ = 'p';
          local_1c8[0]._3_1_ = 'c';
          local_1c8[0]._4_1_ = 't';
          local_1c8[0]._5_1_ = 'b';
          local_1c8[0]._M_local_buf[6] = 'l';
          local_1c8[0]._M_local_buf[7] = 'o';
          local_1c8[0]._8_1_ = 'c';
          local_1c8[0]._9_1_ = 'k';
          local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
          local_1c8[0]._M_local_buf[10] = '\0';
          _maybe_with_witness = (TransactionSerParams *)local_1c8;
          (anonymous_namespace)::PeerManagerImpl::MakeAndPushMessage<CBlockHeaderAndShortTxIDs&>
                    ((PeerManagerImpl *)this,pfrom,(string *)&maybe_with_witness,
                     (CBlockHeaderAndShortTxIDs *)&criticalblock51);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_maybe_with_witness != local_1c8) {
            operator_delete(_maybe_with_witness,
                            CONCAT17(local_1c8[0]._M_local_buf[7],
                                     CONCAT16(local_1c8[0]._M_local_buf[6],
                                              CONCAT24(local_1c8[0]._M_allocated_capacity._4_2_,
                                                       (undefined4)
                                                       local_1c8[0]._M_allocated_capacity))) + 1);
          }
          CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
                    ((CBlockHeaderAndShortTxIDs *)&criticalblock51);
        }
        else if (iVar2 == 0x40000002) {
          local_108._0_6_ = 0x6b636f6c62;
          criticalblock51.super_unique_lock._8_8_ = 5;
          criticalblock51.super_unique_lock._M_device = (mutex_type *)&local_108;
          _maybe_with_witness = &::TX_WITH_WITNESS;
          local_1d0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (anonymous_namespace)::PeerManagerImpl::
          MakeAndPushMessage<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock51,
                     (ParamsWrapper<TransactionSerParams,_const_CBlock> *)&maybe_with_witness);
LAB_00900d76:
          if (criticalblock51.super_unique_lock._M_device != (mutex_type *)&local_108) {
            operator_delete(criticalblock51.super_unique_lock._M_device,(long)local_108 + 1);
          }
        }
      }
      criticalblock57.super_unique_lock._M_device = &(peer->m_block_inv_mutex).super_mutex;
      criticalblock57.super_unique_lock._M_owns = false;
      pPVar32 = peer;
      std::unique_lock<std::mutex>::lock(&criticalblock57.super_unique_lock);
      auVar30[0] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0] ==
                    (puVar7->super_base_blob<256U>).m_data._M_elems[0]);
      auVar30[1] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[1] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 5));
      auVar30[2] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[2] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 6));
      auVar30[3] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[3] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 7));
      auVar30[4] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[4] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 8));
      auVar30[5] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[5] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 9));
      auVar30[6] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[6] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 10));
      auVar30[7] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[7] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0xb));
      auVar30[8] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[8] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0xc));
      auVar30[9] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[9] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0xd));
      auVar30[10] = -((__int_type_conflict2)
                      (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[10] ==
                     (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0xe));
      auVar30[0xb] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xb] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0xf));
      auVar30[0xc] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xc] ==
                      paVar23[1]._M_local_buf[0]);
      auVar30[0xd] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xd] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x11));
      auVar30[0xe] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xe] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x12));
      auVar30[0xf] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0xf] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x13));
      auVar27[0] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x10] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x14));
      auVar27[1] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x11] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x15));
      auVar27[2] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x12] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x16));
      auVar27[3] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x13] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x17));
      auVar27[4] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x14] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x18));
      auVar27[5] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x15] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x19));
      auVar27[6] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x16] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1a));
      auVar27[7] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x17] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1b));
      auVar27[8] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x18] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1c));
      auVar27[9] = -((__int_type_conflict2)
                     (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x19] ==
                    (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1d));
      auVar27[10] = -((__int_type_conflict2)
                      (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1e));
      auVar27[0xb] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x1f));
      auVar27[0xc] = -((peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      paVar23[2]._M_local_buf[0]);
      auVar27[0xd] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x21));
      auVar27[0xe] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x22));
      auVar27[0xf] = -((__int_type_conflict2)
                       (peer->m_continuation_block).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      (__int_type_conflict2)*(__atomic_base<bool> *)((long)paVar23 + 0x23));
      auVar27 = auVar27 & auVar30;
      peer = pPVar32;
      if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_2dc = MSG_BLOCK;
        puVar7 = in_stack_fffffffffffffcd8->phashBlock;
        if (puVar7 == (uint256 *)0x0) {
LAB_00901193:
          __assert_fail("phashBlock != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                        ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
        }
        local_218._M_dataplus._M_p = *(pointer *)(puVar7->super_base_blob<256U>).m_data._M_elems;
        local_218._M_string_length =
             *(size_type *)((puVar7->super_base_blob<256U>).m_data._M_elems + 8);
        local_218.field_2._M_allocated_capacity =
             *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
        local_218.field_2._8_8_ =
             *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
        std::vector<CInv,std::allocator<CInv>>::emplace_back<GetDataMsg,uint256>
                  ((vector<CInv,std::allocator<CInv>> *)&vInv,&local_2dc,(uint256 *)&local_218);
        local_218.field_2._M_allocated_capacity._0_4_ = 0x766e69;
        local_218._M_string_length = 3;
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                  ((PeerManagerImpl *)this,pfrom,&local_218,&vInv);
        puVar7 = &pPVar32->m_continuation_block;
        peer = pPVar32;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = &(pPVar32->m_continuation_block).super_base_blob<256U>;
        (pbVar12->m_data)._M_elems[0x10] = '\0';
        (pbVar12->m_data)._M_elems[0x11] = '\0';
        (pbVar12->m_data)._M_elems[0x12] = '\0';
        (pbVar12->m_data)._M_elems[0x13] = '\0';
        (pbVar12->m_data)._M_elems[0x14] = '\0';
        (pbVar12->m_data)._M_elems[0x15] = '\0';
        (pbVar12->m_data)._M_elems[0x16] = '\0';
        (pbVar12->m_data)._M_elems[0x17] = '\0';
        (pbVar12->m_data)._M_elems[0x18] = '\0';
        (pbVar12->m_data)._M_elems[0x19] = '\0';
        (pbVar12->m_data)._M_elems[0x1a] = '\0';
        (pbVar12->m_data)._M_elems[0x1b] = '\0';
        (pbVar12->m_data)._M_elems[0x1c] = '\0';
        (pbVar12->m_data)._M_elems[0x1d] = '\0';
        (pbVar12->m_data)._M_elems[0x1e] = '\0';
        (pbVar12->m_data)._M_elems[0x1f] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[1] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[2] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[3] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[4] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[5] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[6] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[7] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[8] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[9] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[10] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
        (puVar7->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
        if (vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vInv.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock57.super_unique_lock);
    }
    if (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  this = pPVar31;
  if (a_recent_compact_block.
      super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (a_recent_compact_block.
               super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    this = pPVar31;
  }
  if (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (a_recent_block.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_008fff3f:
  aStack_100._M_allocated_capacity =
       (size_type)
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  criticalblock51.super_unique_lock._8_8_ = *(undefined8 *)aStack_100._M_allocated_capacity;
  criticalblock51.super_unique_lock._M_device =
       (mutex_type *)
       (peer->m_getdata_requests).super__Deque_base<CInv,_std::allocator<CInv>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_108 = (CInv *)(criticalblock51.super_unique_lock._8_8_ + 0x1f8);
  local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_300;
  puVar17 = (((element_type *)((long)local_1d0._M_pi + 0x1c0))->super_CBlockHeader).hashMerkleRoot.
            super_base_blob<256U>.m_data._M_elems + 0x14;
  local_1c8[0]._M_allocated_capacity._0_4_ = SUB84(puVar17,0);
  local_1c8[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)puVar17 >> 0x20);
  local_1c8[0]._M_local_buf[6] = (undefined1)((ulong)puVar17 >> 0x30);
  local_1c8[0]._M_local_buf[7] = (undefined1)((ulong)puVar17 >> 0x38);
  local_1c8[0]._8_2_ = SUB82(local_300,0);
  local_1c8[0]._M_local_buf[10] = (undefined1)((ulong)local_300 >> 0x10);
  local_1c8[0]._M_local_buf[0xb] = (undefined1)((ulong)local_300 >> 0x18);
  local_1c8[0]._12_2_ = (undefined2)((ulong)local_300 >> 0x20);
  local_1c8[0]._14_2_ = (undefined2)((ulong)local_300 >> 0x30);
  __first._M_first = (_Elt_pointer)pfrom;
  __first._M_cur = (_Elt_pointer)in_stack_fffffffffffffcb8;
  __first._M_last._0_7_ = in_stack_fffffffffffffcc8;
  __first._M_last._7_1_ = in_stack_fffffffffffffccf;
  __first._M_node = (_Map_pointer)this;
  __last._M_first = (_Elt_pointer)interruptMsgProc;
  __last._M_cur = (_Elt_pointer)in_stack_fffffffffffffcd8;
  __last._M_last._0_1_ = in_stack_fffffffffffffce8;
  __last._M_last._1_7_ = in_stack_fffffffffffffce9;
  __last._M_node = (_Map_pointer)peer;
  _maybe_with_witness = (TransactionSerParams *)paVar22;
  std::deque<CInv,_std::allocator<CInv>_>::_M_erase
            ((iterator *)local_58,&peer->m_getdata_requests,__first,__last);
  if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"notfound","");
    (anonymous_namespace)::PeerManagerImpl::
    MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
              ((PeerManagerImpl *)this,pfrom,&local_258,&vNotFound);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00900016:
  if (vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vNotFound.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetData(CNode& pfrom, Peer& peer, const std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(cs_main);

    auto tx_relay = peer.GetTxRelay();

    std::deque<CInv>::iterator it = peer.m_getdata_requests.begin();
    std::vector<CInv> vNotFound;

    // Process as many TX items from the front of the getdata queue as
    // possible, since they're common and it's efficient to batch process
    // them.
    while (it != peer.m_getdata_requests.end() && it->IsGenTxMsg()) {
        if (interruptMsgProc) return;
        // The send buffer provides backpressure. If there's no space in
        // the buffer, pause processing until the next call.
        if (pfrom.fPauseSend) break;

        const CInv &inv = *it++;

        if (tx_relay == nullptr) {
            // Ignore GETDATA requests for transactions from block-relay-only
            // peers and peers that asked us not to announce transactions.
            continue;
        }

        CTransactionRef tx = FindTxForGetData(*tx_relay, ToGenTxid(inv));
        if (tx) {
            // WTX and WITNESS_TX imply we serialize with witness
            const auto maybe_with_witness = (inv.IsMsgTx() ? TX_NO_WITNESS : TX_WITH_WITNESS);
            MakeAndPushMessage(pfrom, NetMsgType::TX, maybe_with_witness(*tx));
            m_mempool.RemoveUnbroadcastTx(tx->GetHash());
        } else {
            vNotFound.push_back(inv);
        }
    }

    // Only process one BLOCK item per call, since they're uncommon and can be
    // expensive to process.
    if (it != peer.m_getdata_requests.end() && !pfrom.fPauseSend) {
        const CInv &inv = *it++;
        if (inv.IsGenBlkMsg()) {
            ProcessGetBlockData(pfrom, peer, inv);
        }
        // else: If the first item on the queue is an unknown type, we erase it
        // and continue processing the queue on the next call.
    }

    peer.m_getdata_requests.erase(peer.m_getdata_requests.begin(), it);

    if (!vNotFound.empty()) {
        // Let the peer know that we didn't find what it asked for, so it doesn't
        // have to wait around forever.
        // SPV clients care about this message: it's needed when they are
        // recursively walking the dependencies of relevant unconfirmed
        // transactions. SPV clients want to do that because they want to know
        // about (and store and rebroadcast and risk analyze) the dependencies
        // of transactions relevant to them, without having to download the
        // entire memory pool.
        // Also, other nodes can use these messages to automatically request a
        // transaction from some other peer that announced it, and stop
        // waiting for us to respond.
        // In normal operation, we often send NOTFOUND messages for parents of
        // transactions that we relay; if a peer is missing a parent, they may
        // assume we have them and request the parents from us.
        MakeAndPushMessage(pfrom, NetMsgType::NOTFOUND, vNotFound);
    }
}